

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O1

int onmt::unicode::get_script(code_point_t c,int previous_script)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *pair;
  long lVar4;
  ulong uVar5;
  int unaff_EBX;
  int iVar6;
  bool bVar7;
  UErrorCode error;
  UScriptCode extensions [198];
  undefined4 local_33c;
  int local_338 [200];
  
  bVar7 = compat_scripts == DAT_003886d8;
  lVar4 = compat_scripts;
  while (!bVar7) {
    if (c <= *(int *)(lVar4 + 0x14) && *(int *)(lVar4 + 0x10) <= c) {
      unaff_EBX = *(int *)(lVar4 + 8);
      break;
    }
    lVar4 = lVar4 + 0x18;
    bVar7 = lVar4 == DAT_003886d8;
  }
  iVar6 = unaff_EBX;
  if (bVar7) {
    local_33c = 0;
    iVar2 = uscript_getScript_70(c);
    iVar6 = previous_script;
    if ((iVar2 != 1) && (iVar6 = iVar2, iVar2 == 0)) {
      uVar3 = uscript_getScriptExtensions_70(c,local_338,0xc6,&local_33c);
      bVar7 = 0 < (int)uVar3;
      iVar6 = unaff_EBX;
      if ((0 < (int)uVar3) && (iVar6 = previous_script, local_338[0] != previous_script)) {
        uVar1 = 1;
        do {
          uVar5 = uVar1;
          iVar6 = unaff_EBX;
          if (uVar3 == uVar5) break;
          uVar1 = uVar5 + 1;
          iVar6 = previous_script;
        } while (local_338[uVar5] != previous_script);
        bVar7 = uVar5 < uVar3;
      }
      if (!bVar7) {
        iVar6 = local_338[0];
      }
    }
  }
  return iVar6;
}

Assistant:

int get_script(code_point_t c, int previous_script)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& range = pair.second;
        if (c >= range.first && c <= range.second)
          return pair.first.second;
      }

      UErrorCode error = U_ZERO_ERROR;
      UScriptCode code = uscript_getScript(c, &error);

      switch (code)
      {
      case USCRIPT_INHERITED:
        return previous_script;
      case USCRIPT_COMMON:
      {
        // For common characters, we return previous_script if it is included in
        // their script extensions.
        UScriptCode extensions[USCRIPT_CODE_LIMIT];
        int num_extensions = uscript_getScriptExtensions(c, extensions, USCRIPT_CODE_LIMIT, &error);
        for (int i = 0; i < num_extensions; ++i)
        {
          if (extensions[i] == previous_script)
            return previous_script;
        }
        return extensions[0];
      }
      default:
        return code;
      }
    }